

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chart.cpp
# Opt level: O3

pair<int,_int> __thiscall
Chart::determineHourRange
          (Chart *this,Range *range,vector<Interval,_std::allocator<Interval>_> *tracked)

{
  pointer pIVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  pair<int,_int> pVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  pointer pIVar9;
  Datetime *pDVar10;
  undefined8 *puVar11;
  byte bVar12;
  Datetime day;
  Interval clipped;
  Range day_range;
  uint local_278;
  int local_274;
  undefined1 local_248 [112];
  _Alloc_hider local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  Datetime local_188;
  Interval local_158;
  Range local_98;
  
  bVar12 = 0;
  if ((tracked->super__Vector_base<Interval,_std::allocator<Interval>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (tracked->super__Vector_base<Interval,_std::allocator<Interval>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    pVar5.first = 0;
    pVar5.second = 0x17;
  }
  else {
    local_188._year = (range->start)._year;
    local_188._month = (range->start)._month;
    local_188._week = (range->start)._week;
    local_188._weekday = (range->start)._weekday;
    local_188._julian = (range->start)._julian;
    local_188._day = (range->start)._day;
    local_188._seconds = (range->start)._seconds;
    local_188._offset = (range->start)._offset;
    local_188._utc = (range->start)._utc;
    local_188._33_7_ = *(undefined7 *)&(range->start).field_0x21;
    local_188._date = (range->start)._date;
    bVar2 = Datetime::operator<(&local_188,&range->end);
    if (bVar2) {
      local_278 = 0;
      local_274 = 0x17;
      do {
        getFullDay(&local_98,&local_188);
        pIVar9 = (tracked->super__Vector_base<Interval,_std::allocator<Interval>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pIVar1 = (tracked->super__Vector_base<Interval,_std::allocator<Interval>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pIVar9 != pIVar1) {
          __x = &pIVar9->_tags;
          do {
            pDVar10 = &(((Interval *)(__x + -3))->super_Range).start;
            puVar11 = (undefined8 *)(local_248 + 8);
            for (lVar7 = 0xc; lVar7 != 0; lVar7 = lVar7 + -1) {
              *puVar11 = *(undefined8 *)pDVar10;
              pDVar10 = (Datetime *)((long)pDVar10 + (ulong)bVar12 * -0x10 + 8);
              puVar11 = puVar11 + (ulong)bVar12 * -2 + 1;
            }
            local_248._0_8_ = &PTR__Interval_0019f6e8;
            local_248[0x6c] = *(undefined1 *)((long)(__x + -1) + 0xc);
            local_248._104_4_ = *(undefined4 *)((long)(__x + -1) + 8);
            local_1d8._M_p = (pointer)&local_1c8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1d8,*(long *)((long)(__x + -1) + 0x10),
                       *(long *)((long)(__x + -1) + 0x18) + *(long *)((long)(__x + -1) + 0x10));
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_Rb_tree(&local_1b8,&__x->_M_t);
            bVar2 = Range::is_open((Range *)local_248);
            if (bVar2) {
              local_248._56_4_ = (this->reference_datetime)._year;
              local_248._60_4_ = (this->reference_datetime)._month;
              local_248._64_4_ = (this->reference_datetime)._week;
              local_248._68_4_ = (this->reference_datetime)._weekday;
              local_248._72_4_ = (this->reference_datetime)._julian;
              local_248._76_4_ = (this->reference_datetime)._day;
              local_248._80_4_ = (this->reference_datetime)._seconds;
              local_248._84_4_ = (this->reference_datetime)._offset;
              local_248[0x58] = (this->reference_datetime)._utc;
              local_248._89_7_ = *(undefined7 *)&(this->reference_datetime).field_0x21;
              local_248._96_8_ = (this->reference_datetime)._date;
            }
            bVar2 = Range::overlaps(&local_98,(Range *)local_248);
            if (bVar2) {
              clip(&local_158,(Interval *)local_248,&local_98);
              iVar3 = Datetime::hour(&local_158.super_Range.start);
              if (iVar3 < local_274) {
                local_274 = Datetime::hour(&local_158.super_Range.start);
              }
              bVar2 = Range::is_open(&local_158.super_Range);
              if ((!bVar2) &&
                 (iVar3 = Datetime::hour(&local_158.super_Range.end), (int)local_278 < iVar3)) {
                local_278 = Datetime::hour(&local_158.super_Range.end);
              }
              local_158.super_Range._vptr_Range = (_func_int **)&PTR__Interval_0019f6e8;
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~_Rb_tree(&local_158._tags._M_t);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158.annotation._M_dataplus._M_p != &local_158.annotation.field_2) {
                operator_delete(local_158.annotation._M_dataplus._M_p,
                                local_158.annotation.field_2._M_allocated_capacity + 1);
              }
            }
            local_248._0_8_ = &PTR__Interval_0019f6e8;
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree(&local_1b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._M_p != &local_1c8) {
              operator_delete(local_1d8._M_p,local_1c8._M_allocated_capacity + 1);
            }
            pIVar9 = (pointer)(__x + 1);
            __x = __x + 4;
          } while (pIVar9 != pIVar1);
        }
        Datetime::operator++(&local_188,0);
        bVar2 = Datetime::operator<(&local_188,&range->end);
      } while (bVar2);
    }
    else {
      local_274 = 0x17;
      local_278 = 0;
    }
    if ((local_274 == 0x17) && (local_278 == 0)) {
      uVar4 = this->reference_hour;
      uVar6 = 0x16;
      if ((int)uVar4 < 0x16) {
        uVar6 = uVar4;
      }
      uVar8 = (ulong)(uVar6 + 1);
    }
    else {
      iVar3 = 1;
      if (1 < local_274) {
        iVar3 = local_274;
      }
      uVar4 = iVar3 - 1;
      uVar8 = 0x17;
      if ((int)local_278 < 0x17) {
        uVar8 = (ulong)local_278;
      }
    }
    pVar5 = (pair<int,_int>)((ulong)uVar4 | uVar8 << 0x20);
  }
  return pVar5;
}

Assistant:

std::pair <int, int> Chart::determineHourRange (
  const Range& range,
  const std::vector <Interval>& tracked)
{
  // If there is no data, show the whole day.
  if (tracked.empty ())
  {
    return std::make_pair (0, 23);
  }

  // Get the extreme time range for the filtered data.
  auto first_hour = 23;
  auto last_hour = 0;

  for (Datetime day = range.start; day < range.end; day++)
  {
    auto day_range = getFullDay (day);

    for (auto& track : tracked)
    {
      Interval test {track};

      if (test.is_open ())
      {
        test.end = reference_datetime;
      }

      if (day_range.overlaps (test))
      {
        Interval clipped = clip (test, day_range);

        if (clipped.start.hour () < first_hour)
        {
          first_hour = clipped.start.hour ();
        }

        if (! clipped.is_open () && clipped.end.hour () > last_hour)
        {
          last_hour = clipped.end.hour ();
        }
      }
    }
  }

  if (first_hour == 23 && last_hour == 0)
  {
    first_hour = reference_hour;
    last_hour = std::min (first_hour + 1, 23);
  }
  else
  {
    first_hour = std::max (first_hour - 1, 0);
    last_hour = std::min (last_hour, 23);
  }

  return std::make_pair (first_hour, last_hour);
}